

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_xoris(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 ret;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  target_ulong uimm;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = UIMM(ctx->opcode);
  uVar2 = rS(ctx->opcode);
  uVar3 = rA(ctx->opcode);
  if ((uVar2 != uVar3) || ((ulong)uVar1 != 0)) {
    uVar2 = rA(ctx->opcode);
    ret = cpu_gpr[uVar2];
    uVar2 = rS(ctx->opcode);
    tcg_gen_xori_i64_ppc64(tcg_ctx_00,ret,cpu_gpr[uVar2],(ulong)uVar1 << 0x10);
  }
  return;
}

Assistant:

static void gen_xoris(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm = UIMM(ctx->opcode);

    if (rS(ctx->opcode) == rA(ctx->opcode) && uimm == 0) {
        /* NOP */
        return;
    }
    tcg_gen_xori_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rS(ctx->opcode)],
                    uimm << 16);
}